

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heter_queue.h
# Opt level: O2

ControlBlock * __thiscall
density::heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>::
start_consume_impl(heter_queue<density::runtime_type<>,_density_tests::move_only_void_allocator>
                   *this)

{
  ulong uVar1;
  ControlBlock *pCVar2;
  
  pCVar2 = this->m_head;
  while( true ) {
    if (pCVar2 == this->m_tail) {
      return (ControlBlock *)0x0;
    }
    uVar1 = pCVar2->m_next;
    if ((uVar1 & 3) == 0) break;
    pCVar2 = (ControlBlock *)(uVar1 & 0xfffffffffffffff8);
  }
  pCVar2->m_next = uVar1 | 1;
  return pCVar2;
}

Assistant:

ControlBlock * start_consume_impl() noexcept
        {
            auto       curr = m_head;
            auto const tail = m_tail;
            while (curr != tail)
            {
                if ((curr->m_next & (detail::Queue_Busy | detail::Queue_Dead)) == 0)
                {
                    curr->m_next += detail::Queue_Busy;
                    return curr;
                }

                curr = reinterpret_cast<ControlBlock *>(curr->m_next & ~detail::Queue_AllFlags);
            }

            return nullptr;
        }